

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O1

RHANDLE PAL_LocalHandleToRemote(HANDLE hLocal)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  CPalThread *pCVar4;
  LPVOID pvVar5;
  int *piVar6;
  RHANDLE p_Var7;
  long *local_30;
  IPalObject *pobj;
  
  local_30 = (long *)0x0;
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001367e5;
  pCVar4 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if (pCVar4 == (CPalThread *)0x0) {
    pCVar4 = CreateCurrentThreadData();
  }
  bVar2 = CorUnix::HandleIsSpecial(hLocal);
  if (bVar2) {
    if ((undefined1 *)hLocal == &DAT_ffffff01) {
      local_30 = CorUnix::g_pobjProcess;
      (**(code **)(*CorUnix::g_pobjProcess + 0x38))();
LAB_00136711:
      plVar1 = local_30;
      iVar3 = (**(code **)(*local_30 + 0x88))(local_30,pCVar4);
      if (iVar3 == 0) {
        SHMLock();
        pvVar5 = SHMPtrToPtr(plVar1[0x20]);
        if (pvVar5 == (LPVOID)0x0) {
          fprintf(_stderr,"] %s %s:%d","PAL_LocalHandleToRemote",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x4f0);
          fprintf(_stderr,"Unable to map shared object data\n");
          p_Var7 = (RHANDLE)&DAT_ffffffffffffffff;
          iVar3 = 0x54f;
        }
        else {
          *(int *)((long)pvVar5 + 0x30) = *(int *)((long)pvVar5 + 0x30) + 1;
          p_Var7 = (RHANDLE)plVar1[0x20];
        }
        SHMRelease();
      }
      else {
        p_Var7 = (RHANDLE)&DAT_ffffffffffffffff;
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_001367e5;
      }
    }
    else {
      fprintf(_stderr,"] %s %s:%d","PAL_LocalHandleToRemote",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x4c9);
      fprintf(_stderr,"Invalid special handle type passed to PAL_LocalHandleToRemote\n");
      p_Var7 = (RHANDLE)&DAT_ffffffffffffffff;
      iVar3 = 6;
    }
  }
  else {
    iVar3 = (**(code **)(*CorUnix::g_pObjectManager + 0x28))
                      (CorUnix::g_pObjectManager,pCVar4,hLocal,&aotRemotable,0,&local_30);
    if (iVar3 == 0) goto LAB_00136711;
    p_Var7 = (RHANDLE)&DAT_ffffffffffffffff;
  }
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 0x40))(local_30,pCVar4);
  }
  if (iVar3 != 0) {
    piVar6 = __errno_location();
    *piVar6 = iVar3;
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return p_Var7;
  }
LAB_001367e5:
  abort();
}

Assistant:

PALIMPORT
RHANDLE
PALAPI
PAL_LocalHandleToRemote(IN HANDLE hLocal)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pthr;
    IPalObject *pobj = NULL;
    CSharedMemoryObject *pshmobj;
    SHMObjData *psmod = NULL;
    RHANDLE hRemote = reinterpret_cast<RHANDLE>(INVALID_HANDLE_VALUE);

    PERF_ENTRY(PAL_LocalHandleToRemote);
    ENTRY("PAL_LocalHandleToRemote( hLocal=0x%lx )\n", hLocal);

    pthr = InternalGetCurrentThread();

    if (!HandleIsSpecial(hLocal))
    {
        palError = g_pObjectManager->ReferenceObjectByHandle(
            pthr,
            hLocal,
            &aotRemotable,
            0,
            &pobj
            );

        if (NO_ERROR != palError)
        {
            goto PAL_LocalHandleToRemoteExitNoLockRelease;
        }
    }
    else if (hPseudoCurrentProcess == hLocal)
    {
        pobj = g_pobjProcess;
        pobj->AddReference();
    }
    else
    {
        ASSERT("Invalid special handle type passed to PAL_LocalHandleToRemote\n");
        palError = ERROR_INVALID_HANDLE;
        goto PAL_LocalHandleToRemoteExitNoLockRelease;
    }

    pshmobj = static_cast<CSharedMemoryObject*>(pobj);

    //
    // Make sure that the object is shared
    //

    palError = pshmobj->EnsureObjectIsShared(pthr);
    if (NO_ERROR != palError)
    {
        ERROR("Failure %d promoting object\n", palError);
        goto PAL_LocalHandleToRemoteExitNoLockRelease;
    }

    SHMLock();
    
    psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, pshmobj->GetShmObjData());
    if (NULL != psmod)
    {
        //
        // Bump up the process ref count by 1. The receiving process will not
        // increase the ref count when it converts the remote handle to
        // local.
        //
        
        psmod->lProcessRefCount += 1;

        //
        // The remote handle is simply the SHMPTR for the SHMObjData
        //

        hRemote = reinterpret_cast<RHANDLE>(pshmobj->GetShmObjData());
    }
    else
    {
        ASSERT("Unable to map shared object data\n");
        palError = ERROR_INTERNAL_ERROR;
        goto PAL_LocalHandleToRemoteExit;
    }

PAL_LocalHandleToRemoteExit:

    SHMRelease();

PAL_LocalHandleToRemoteExitNoLockRelease:

    if (NULL != pobj)
    {
        pobj->ReleaseReference(pthr);
    }

    if (NO_ERROR != palError)
    {
        pthr->SetLastError(palError);
    }
    
    LOGEXIT("PAL_LocalHandleToRemote returns RHANDLE 0x%lx\n", hRemote);
    PERF_EXIT(PAL_LocalHandleToRemote);
    return hRemote;
}